

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiID ImGui::GetIDWithSeed(char *str,char *str_end,ImGuiID seed)

{
  ImGuiID IVar1;
  ImGuiID in_EDX;
  long in_RSI;
  char *in_RDI;
  ImGuiContext *g;
  ImGuiID id;
  void *in_stack_00000060;
  void *in_stack_00000068;
  ImGuiDataType in_stack_00000070;
  ImGuiID in_stack_00000074;
  size_t local_30;
  
  if (in_RSI == 0) {
    local_30 = 0;
  }
  else {
    local_30 = in_RSI - (long)in_RDI;
  }
  IVar1 = ImHashStr(in_RDI,local_30,in_EDX);
  if (GImGui->DebugHookIdInfo == IVar1) {
    DebugHookIdInfo(in_stack_00000074,in_stack_00000070,in_stack_00000068,in_stack_00000060);
  }
  return IVar1;
}

Assistant:

ImGuiID ImGui::GetIDWithSeed(const char* str, const char* str_end, ImGuiID seed)
{
    ImGuiID id = ImHashStr(str, str_end ? (str_end - str) : 0, seed);
#ifndef IMGUI_DISABLE_DEBUG_TOOLS
    ImGuiContext& g = *GImGui;
    if (g.DebugHookIdInfo == id)
        DebugHookIdInfo(id, ImGuiDataType_String, str, str_end);
#endif
    return id;
}